

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

bool __thiscall FIX::BoolField::getValue(BoolField *this)

{
  bool bVar1;
  
  bVar1 = BoolConvertor::convert(&(this->super_FieldBase).m_string);
  return bVar1;
}

Assistant:

bool getValue() const EXCEPT ( IncorrectDataFormat )
    { try
      { return BoolConvertor::convert( getString() ); }
      catch( FieldConvertError& )
      { throw IncorrectDataFormat( getTag(), getString() ); } }